

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_assignment_no_alias<Eigen::Matrix<int,4,1,0,4,1>,Eigen::Matrix<int,4,1,0,4,1>,Eigen::internal::add_assign_op<int,int>>
               (Matrix<int,_4,_1,_0,_4,_1> *dst,Matrix<int,_4,_1,_0,_4,_1> *src,
               add_assign_op<int,_int> *func)

{
  ActualDstType actualDst;
  add_assign_op<int,_int> *func_local;
  Matrix<int,_4,_1,_0,_4,_1> *src_local;
  Matrix<int,_4,_1,_0,_4,_1> *dst_local;
  
  Assignment<Eigen::Matrix<int,_4,_1,_0,_4,_1>,_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_Eigen::internal::add_assign_op<int,_int>,_Eigen::internal::Dense2Dense,_void>
  ::run(dst,src,func);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void call_assignment_no_alias(Dst& dst, const Src& src, const Func& func)
{
  enum {
    NeedToTranspose = (    (int(Dst::RowsAtCompileTime) == 1 && int(Src::ColsAtCompileTime) == 1)
                        || (int(Dst::ColsAtCompileTime) == 1 && int(Src::RowsAtCompileTime) == 1)
                      ) && int(Dst::SizeAtCompileTime) != 1
  };

  typedef typename internal::conditional<NeedToTranspose, Transpose<Dst>, Dst>::type ActualDstTypeCleaned;
  typedef typename internal::conditional<NeedToTranspose, Transpose<Dst>, Dst&>::type ActualDstType;
  ActualDstType actualDst(dst);

  // TODO check whether this is the right place to perform these checks:
  EIGEN_STATIC_ASSERT_LVALUE(Dst)
  EIGEN_STATIC_ASSERT_SAME_MATRIX_SIZE(ActualDstTypeCleaned,Src)
  EIGEN_CHECK_BINARY_COMPATIBILIY(Func,typename ActualDstTypeCleaned::Scalar,typename Src::Scalar);

  Assignment<ActualDstTypeCleaned,Src,Func>::run(actualDst, src, func);
}